

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_datanode.c
# Opt level: O3

SUNErrCode
SUNDataNode_SetData(SUNDataNode self,SUNMemoryType src_mem_type,SUNMemoryType node_mem_type,
                   void *data,size_t data_stride,size_t data_bytes)

{
  _func_SUNErrCode_SUNDataNode_SUNMemoryType_SUNMemoryType_void_ptr_size_t_size_t
  *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  UNRECOVERED_JUMPTABLE = self->ops->setdata;
  if (UNRECOVERED_JUMPTABLE !=
      (_func_SUNErrCode_SUNDataNode_SUNMemoryType_SUNMemoryType_void_ptr_size_t_size_t *)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(self,src_mem_type,node_mem_type,data,data_stride,data_bytes);
    return SVar1;
  }
  return -0x2701;
}

Assistant:

SUNErrCode SUNDataNode_SetData(SUNDataNode self, SUNMemoryType src_mem_type,
                               SUNMemoryType node_mem_type, void* data,
                               size_t data_stride, size_t data_bytes)
{
  SUNFunctionBegin(self->sunctx);

  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);

  if (self->ops->setdata)
  {
    SUNErrCode err = self->ops->setdata(self, src_mem_type, node_mem_type, data,
                                        data_stride, data_bytes);
    SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
    return err;
  }

  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
  return SUN_ERR_NOT_IMPLEMENTED;
}